

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

void __thiscall
Catch::formatReconstructedExpression(Catch *this,ostream *os,string *lhs,StringRef op,string *rhs)

{
  long lVar1;
  ostream *poVar2;
  char *pcVar3;
  undefined8 *puVar4;
  
  puVar4 = (undefined8 *)op.m_size;
  if ((ulong)(puVar4[1] + *(long *)(os + 8)) < 0x28) {
    lVar1 = std::__cxx11::string::find((char)os,10);
    if (lVar1 == -1) {
      lVar1 = std::__cxx11::string::find((char)op.m_size,10);
      if (lVar1 == -1) {
        pcVar3 = " ";
        goto LAB_0012afff;
      }
    }
  }
  pcVar3 = "\n";
LAB_0012afff:
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)this,*(char **)os,*(long *)(os + 8));
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,pcVar3,1);
  poVar2 = (ostream *)std::ostream::write((char *)poVar2,(long)lhs);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,pcVar3,1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,(char *)*puVar4,puVar4[1]);
  return;
}

Assistant:

void formatReconstructedExpression( std::ostream &os, std::string const& lhs, StringRef op, std::string const& rhs ) {
        if( lhs.size() + rhs.size() < 40 &&
                lhs.find('\n') == std::string::npos &&
                rhs.find('\n') == std::string::npos )
            os << lhs << " " << op << " " << rhs;
        else
            os << lhs << "\n" << op << "\n" << rhs;
    }